

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleSerialAnalyzer::SimpleSerialAnalyzer(SimpleSerialAnalyzer *this)

{
  SimpleSerialAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SimpleSerialAnalyzer_0010aca0;
  SimpleSerialAnalyzerSettings::SimpleSerialAnalyzerSettings(&this->mSettings);
  std::unique_ptr<SimpleSerialAnalyzerResults,std::default_delete<SimpleSerialAnalyzerResults>>::
  unique_ptr<std::default_delete<SimpleSerialAnalyzerResults>,void>
            ((unique_ptr<SimpleSerialAnalyzerResults,std::default_delete<SimpleSerialAnalyzerResults>>
              *)&this->mResults);
  SimpleSerialSimulationDataGenerator::SimpleSerialSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

SimpleSerialAnalyzer::SimpleSerialAnalyzer()
:	Analyzer2(),  
	mSettings(),
	mSimulationInitilized( false )
{
	SetAnalyzerSettings( &mSettings );
}